

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  OfType OVar2;
  char *pcVar3;
  long in_RDI;
  string *in_stack_fffffffffffffd38;
  AssertionResult *in_stack_fffffffffffffd40;
  allocator *paVar4;
  char *in_stack_fffffffffffffd48;
  AssertionPrinter *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Code colour;
  AssertionPrinter *in_stack_fffffffffffffd80;
  AssertionPrinter *this_00;
  AssertionPrinter *in_stack_fffffffffffffd90;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [4];
  Code in_stack_fffffffffffffe0c;
  AssertionPrinter *in_stack_fffffffffffffe10;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [40];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  MessageInfo *local_18;
  undefined8 local_10;
  
  colour = (Code)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  printSourceInfo(in_stack_fffffffffffffd90);
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_fffffffffffffd38);
  __gnu_cxx::
  __normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
  ::__normal_iterator<Catch::MessageInfo*>
            ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffd40,
             (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffd38);
  *(undefined8 *)(in_RDI + 0x30) = local_10;
  OVar2 = AssertionResult::getResultType(*(AssertionResult **)(in_RDI + 0x10));
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      pcVar3 = passedString();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar3,&local_39);
      printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      printOriginalExpression(in_stack_fffffffffffffd80);
      printReconstructedExpression(in_stack_fffffffffffffd80);
      bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1c874f);
      if (!bVar1) {
        printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        return;
      }
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      return;
    }
    if (OVar2 == Info) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"info",&local_181);
      printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      printMessage(in_stack_fffffffffffffd50);
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      return;
    }
    if (OVar2 == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,"warning",&local_1a9);
      printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      printMessage(in_stack_fffffffffffffd50);
      dimColour();
      printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(in_stack_fffffffffffffd40);
        if (bVar1) {
          failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90," - but was ok",&local_91);
          std::operator+(in_stack_fffffffffffffd48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd40);
          printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        else {
          pcVar3 = failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,pcVar3,&local_b9);
          printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        }
        printOriginalExpression(in_stack_fffffffffffffd80);
        printReconstructedExpression(in_stack_fffffffffffffd80);
        dimColour();
        printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        pcVar3 = failedString();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,pcVar3,&local_1d1);
        printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        paVar4 = &local_1f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"explicitly",paVar4);
        printIssue((AssertionPrinter *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          pcVar3 = failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,pcVar3,&local_e1);
          printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"unexpected exception with message:",&local_109);
          printIssue((AssertionPrinter *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
          printMessage(in_stack_fffffffffffffd50);
          printExpressionWas(in_stack_fffffffffffffd50);
          dimColour();
          printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          return;
        }
        if (OVar2 != DidntThrowException) {
          return;
        }
        pcVar3 = failedString();
        this_00 = (AssertionPrinter *)local_131;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_131 + 1),pcVar3,(allocator *)this_00);
        printResultType(this_00,(Code)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffd70);
        std::__cxx11::string::~string((string *)(local_131 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_131);
        paVar4 = &local_159;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"expected exception, got none",paVar4);
        printIssue((AssertionPrinter *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        printExpressionWas(in_stack_fffffffffffffd50);
        dimColour();
        printRemainingMessages(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        return;
      }
    }
  }
  paVar4 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"** internal error **",paVar4);
  printResultType(in_stack_fffffffffffffd80,colour,in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }